

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<ArgumentData,_16U>::grow(SmallArray<ArgumentData,_16U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ArgumentData *pAVar4;
  uint count;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ArgumentData *pAVar12;
  long lVar13;
  uint i;
  uint uVar14;
  ulong uVar15;
  
  uVar14 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar14) {
    count = uVar14;
  }
  if (this->allocator == (Allocator *)0x0) {
    pAVar12 = NULLC::construct<ArgumentData>(count);
  }
  else {
    pAVar12 = Allocator::construct<ArgumentData>(this->allocator,count);
  }
  lVar13 = 0;
  uVar15 = 0;
  while( true ) {
    pAVar4 = this->data;
    if (this->count <= uVar15) break;
    puVar1 = (undefined4 *)((long)&pAVar4->source + lVar13);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    uVar7 = puVar1[2];
    uVar8 = puVar1[3];
    puVar3 = (undefined8 *)((long)&pAVar4->name + lVar13);
    uVar9 = *puVar3;
    uVar10 = puVar3[1];
    puVar3 = (undefined8 *)((long)&pAVar4->value + lVar13);
    uVar11 = puVar3[1];
    puVar2 = (undefined8 *)((long)&pAVar12->value + lVar13);
    *puVar2 = *puVar3;
    puVar2[1] = uVar11;
    puVar3 = (undefined8 *)((long)&pAVar12->name + lVar13);
    *puVar3 = uVar9;
    puVar3[1] = uVar10;
    puVar1 = (undefined4 *)((long)&pAVar12->source + lVar13);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    puVar1[2] = uVar7;
    puVar1[3] = uVar8;
    uVar15 = uVar15 + 1;
    lVar13 = lVar13 + 0x30;
  }
  if (pAVar4 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pAVar4 != (ArgumentData *)0x0) {
        (*(code *)NULLC::dealloc)(pAVar4);
      }
    }
    else if (pAVar4 != (ArgumentData *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pAVar12;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}